

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleSlope(int src_width,int src_height,int dst_width,int dst_height,FilterMode filtering,
               int *x,int *y,int *dx,int *dy)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_10;
  int local_c;
  
  local_c = in_EDX;
  if ((in_EDX == 1) && (0x7fff < in_EDI)) {
    local_c = in_EDI;
  }
  local_10 = in_ECX;
  if ((in_ECX == 1) && (0x7fff < in_ESI)) {
    local_10 = in_ESI;
  }
  if (in_R8D == 3) {
    iVar1 = libyuv::Abs(in_EDI);
    iVar1 = FixedDiv_X86(iVar1,local_c);
    *in_stack_00000010 = iVar1;
    iVar1 = FixedDiv_X86(in_ESI,local_10);
    *in_stack_00000018 = iVar1;
    *in_R9 = 0;
    *in_stack_00000008 = 0;
  }
  else if (in_R8D == 2) {
    iVar1 = libyuv::Abs(in_EDI);
    if (iVar1 < local_c) {
      if (1 < local_c) {
        iVar1 = libyuv::Abs(in_EDI);
        iVar1 = FixedDiv1_X86(iVar1,local_c);
        *in_stack_00000010 = iVar1;
        *in_R9 = 0;
      }
    }
    else {
      iVar1 = libyuv::Abs(in_EDI);
      iVar1 = FixedDiv_X86(iVar1,local_c);
      *in_stack_00000010 = iVar1;
      if (*in_stack_00000010 < 0) {
        local_28 = -((-*in_stack_00000010 >> 1) + -0x8000);
      }
      else {
        local_28 = (*in_stack_00000010 >> 1) + -0x8000;
      }
      *in_R9 = local_28;
    }
    if (in_ESI < local_10) {
      if (1 < local_10) {
        iVar1 = FixedDiv1_X86(in_ESI,local_10);
        *in_stack_00000018 = iVar1;
        *in_stack_00000008 = 0;
      }
    }
    else {
      iVar1 = FixedDiv_X86(in_ESI,local_10);
      *in_stack_00000018 = iVar1;
      if (*in_stack_00000018 < 0) {
        local_2c = -((-*in_stack_00000018 >> 1) + -0x8000);
      }
      else {
        local_2c = (*in_stack_00000018 >> 1) + -0x8000;
      }
      *in_stack_00000008 = local_2c;
    }
  }
  else if (in_R8D == 1) {
    iVar1 = libyuv::Abs(in_EDI);
    if (iVar1 < local_c) {
      if (1 < local_c) {
        iVar1 = libyuv::Abs(in_EDI);
        iVar1 = FixedDiv1_X86(iVar1,local_c);
        *in_stack_00000010 = iVar1;
        *in_R9 = 0;
      }
    }
    else {
      iVar1 = libyuv::Abs(in_EDI);
      iVar1 = FixedDiv_X86(iVar1,local_c);
      *in_stack_00000010 = iVar1;
      if (*in_stack_00000010 < 0) {
        local_34 = -((-*in_stack_00000010 >> 1) + -0x8000);
      }
      else {
        local_34 = (*in_stack_00000010 >> 1) + -0x8000;
      }
      *in_R9 = local_34;
    }
    iVar1 = FixedDiv_X86(in_ESI,local_10);
    *in_stack_00000018 = iVar1;
    *in_stack_00000008 = *in_stack_00000018 >> 1;
  }
  else {
    iVar1 = libyuv::Abs(in_EDI);
    iVar1 = FixedDiv_X86(iVar1,local_c);
    *in_stack_00000010 = iVar1;
    iVar1 = FixedDiv_X86(in_ESI,local_10);
    *in_stack_00000018 = iVar1;
    if (*in_stack_00000010 < 0) {
      local_38 = -(-*in_stack_00000010 >> 1);
    }
    else {
      local_38 = *in_stack_00000010 >> 1;
    }
    *in_R9 = local_38;
    if (*in_stack_00000018 < 0) {
      local_3c = -(-*in_stack_00000018 >> 1);
    }
    else {
      local_3c = *in_stack_00000018 >> 1;
    }
    *in_stack_00000008 = local_3c;
  }
  if (in_EDI < 0) {
    *in_R9 = (local_c + -1) * *in_stack_00000010 + *in_R9;
    *in_stack_00000010 = -*in_stack_00000010;
  }
  return;
}

Assistant:

void ScaleSlope(int src_width,
                int src_height,
                int dst_width,
                int dst_height,
                enum FilterMode filtering,
                int* x,
                int* y,
                int* dx,
                int* dy) {
  assert(x != NULL);
  assert(y != NULL);
  assert(dx != NULL);
  assert(dy != NULL);
  assert(src_width != 0);
  assert(src_height != 0);
  assert(dst_width > 0);
  assert(dst_height > 0);
  // Check for 1 pixel and avoid FixedDiv overflow.
  if (dst_width == 1 && src_width >= 32768) {
    dst_width = src_width;
  }
  if (dst_height == 1 && src_height >= 32768) {
    dst_height = src_height;
  }
  if (filtering == kFilterBox) {
    // Scale step for point sampling duplicates all pixels equally.
    *dx = FixedDiv(Abs(src_width), dst_width);
    *dy = FixedDiv(src_height, dst_height);
    *x = 0;
    *y = 0;
  } else if (filtering == kFilterBilinear) {
    // Scale step for bilinear sampling renders last pixel once for upsample.
    if (dst_width <= Abs(src_width)) {
      *dx = FixedDiv(Abs(src_width), dst_width);
      *x = CENTERSTART(*dx, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_width > 1) {
      *dx = FixedDiv1(Abs(src_width), dst_width);
      *x = 0;
    }
    if (dst_height <= src_height) {
      *dy = FixedDiv(src_height, dst_height);
      *y = CENTERSTART(*dy, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_height > 1) {
      *dy = FixedDiv1(src_height, dst_height);
      *y = 0;
    }
  } else if (filtering == kFilterLinear) {
    // Scale step for bilinear sampling renders last pixel once for upsample.
    if (dst_width <= Abs(src_width)) {
      *dx = FixedDiv(Abs(src_width), dst_width);
      *x = CENTERSTART(*dx, -32768);  // Subtract 0.5 (32768) to center filter.
    } else if (dst_width > 1) {
      *dx = FixedDiv1(Abs(src_width), dst_width);
      *x = 0;
    }
    *dy = FixedDiv(src_height, dst_height);
    *y = *dy >> 1;
  } else {
    // Scale step for point sampling duplicates all pixels equally.
    *dx = FixedDiv(Abs(src_width), dst_width);
    *dy = FixedDiv(src_height, dst_height);
    *x = CENTERSTART(*dx, 0);
    *y = CENTERSTART(*dy, 0);
  }
  // Negative src_width means horizontally mirror.
  if (src_width < 0) {
    *x += (dst_width - 1) * *dx;
    *dx = -*dx;
    // src_width = -src_width;   // Caller must do this.
  }
}